

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenEnum
          (KotlinGenerator *this,EnumDef *enum_def,CodeWriter *writer)

{
  CodeWriter *code;
  allocator<char> local_111;
  string local_110;
  anon_class_24_3_9f199379 local_f0;
  function<void_()> local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  string local_40;
  CodeWriter *local_20;
  CodeWriter *writer_local;
  EnumDef *enum_def_local;
  KotlinGenerator *this_local;
  
  if (((enum_def->super_Definition).generated & 1U) == 0) {
    local_20 = writer;
    writer_local = (CodeWriter *)enum_def;
    enum_def_local = (EnumDef *)this;
    GenerateComment(this,&(enum_def->super_Definition).doc_comment,writer,
                    (CommentConfig *)(anonymous_namespace)::comment_config);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"@Suppress(\"unused\")",&local_41);
    CodeWriter::operator+=(local_20,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    IdlNamer::Type_abi_cxx11_(&local_b8,&this->namer_,(EnumDef *)writer_local);
    std::operator+(&local_98,"class ",&local_b8);
    std::operator+(&local_78,&local_98," private constructor() {");
    CodeWriter::operator+=(local_20,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    CodeWriter::IncrementIdentLevel(local_20);
    code = local_20;
    local_f0.enum_def = (EnumDef *)writer_local;
    local_f0.writer = local_20;
    local_f0.this = this;
    std::function<void()>::
    function<flatbuffers::kotlin::KotlinGenerator::GenEnum(flatbuffers::EnumDef&,flatbuffers::CodeWriter&)const::_lambda()_1_,void>
              ((function<void()> *)&local_d8,&local_f0);
    GenerateCompanionObject(this,code,&local_d8);
    std::function<void_()>::~function(&local_d8);
    CodeWriter::DecrementIdentLevel(local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"}",&local_111);
    CodeWriter::operator+=(local_20,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
  }
  return;
}

Assistant:

void GenEnum(EnumDef &enum_def, CodeWriter &writer) const {
    if (enum_def.generated) return;

    GenerateComment(enum_def.doc_comment, writer, &comment_config);

    writer += "@Suppress(\"unused\")";
    writer += "class " + namer_.Type(enum_def) + " private constructor() {";
    writer.IncrementIdentLevel();

    GenerateCompanionObject(writer, [&]() {
      // Write all properties
      auto vals = enum_def.Vals();
      for (auto it = vals.begin(); it != vals.end(); ++it) {
        auto &ev = **it;
        auto field_type = GenTypeBasic(enum_def.underlying_type.base_type);
        auto val = enum_def.ToString(ev);
        auto suffix = LiteralSuffix(enum_def.underlying_type.base_type);
        writer.SetValue("name", namer_.Variant(ev.name));
        writer.SetValue("type", field_type);
        writer.SetValue("val", val + suffix);
        GenerateComment(ev.doc_comment, writer, &comment_config);
        writer += "const val {{name}}: {{type}} = {{val}}";
      }

      // Generate a generate string table for enum values.
      // Problem is, if values are very sparse that could generate really
      // big tables. Ideally in that case we generate a map lookup
      // instead, but for the moment we simply don't output a table at all.
      auto range = enum_def.Distance();
      // Average distance between values above which we consider a table
      // "too sparse". Change at will.
      static const uint64_t kMaxSparseness = 5;
      bool generate_names =
          range / static_cast<uint64_t>(enum_def.size()) < kMaxSparseness &&
          parser_.opts.mini_reflect == IDLOptions::kTypesAndNames;
      if (generate_names) {
        GeneratePropertyOneLine(writer, "names", "Array<String>", [&]() {
          writer += "arrayOf(\\";
          auto val = enum_def.Vals().front();
          for (auto it = vals.begin(); it != vals.end(); ++it) {
            auto ev = *it;
            for (auto k = enum_def.Distance(val, ev); k > 1; --k)
              writer += "\"\", \\";
            val = ev;
            writer += "\"" + (*it)->name + "\"\\";
            if (it + 1 != vals.end()) { writer += ", \\"; }
          }
          writer += ")";
        });
        GenerateFunOneLine(
            writer, "name", "e: Int", "String",
            [&]() {
              writer += "names[e\\";
              if (enum_def.MinValue()->IsNonZero())
                writer += " - " + enum_def.MinValue()->name + ".toInt()\\";
              writer += "]";
            },
            parser_.opts.gen_jvmstatic);
      }
    });
    writer.DecrementIdentLevel();
    writer += "}";
  }